

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::SetPackageToPrefixMappingsPath
          (objectivec *this,string_view file_path)

{
  string_view path;
  string_view file_path_local;
  
  path._M_str = (char *)file_path._M_len;
  path._M_len = (size_t)this;
  anon_unknown_0::PrefixModeStorage::set_package_to_prefix_mappings_path
            ((anonymous_namespace)::g_prefix_mode,path);
  return;
}

Assistant:

void SetPackageToPrefixMappingsPath(absl::string_view file_path) {
  g_prefix_mode.set_package_to_prefix_mappings_path(file_path);
}